

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

void customrequest_helper(OperationConfig *config,HttpReq req,char *method)

{
  int iVar1;
  undefined8 local_58;
  char *dflt [6];
  char *method_local;
  HttpReq req_local;
  OperationConfig *config_local;
  
  memcpy(&local_58,&DAT_0014f320,0x30);
  if (method != (char *)0x0) {
    iVar1 = curl_strequal(method,dflt[(ulong)req - 1]);
    if (iVar1 == 0) {
      iVar1 = curl_strequal(method,"head");
      if (iVar1 != 0) {
        warnf(config->global,
              "Setting custom HTTP method to HEAD with -X/--request may not work the way you want. Consider using -I/--head instead."
             );
      }
    }
    else {
      notef(config->global,"Unnecessary use of -X or --request, %s is already inferred.",
            dflt[(ulong)req - 1]);
    }
  }
  return;
}

Assistant:

void customrequest_helper(struct OperationConfig *config, HttpReq req,
                          char *method)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *dflt[]= {
    "GET",
    "GET",
    "HEAD",
    "POST",
    "POST",
    "PUT"
  };

  if(!method)
    ;
  else if(curl_strequal(method, dflt[req])) {
    notef(config->global, "Unnecessary use of -X or --request, %s is already "
          "inferred.", dflt[req]);
  }
  else if(curl_strequal(method, "head")) {
    warnf(config->global,
          "Setting custom HTTP method to HEAD with -X/--request may not work "
          "the way you want. Consider using -I/--head instead.");
  }
}